

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatSystem.cpp
# Opt level: O3

vector<FatEntry,_std::allocator<FatEntry>_> * __thiscall
FatSystem::getEntries
          (vector<FatEntry,_std::allocator<FatEntry>_> *__return_storage_ptr__,FatSystem *this,
          uint cluster,int *clusters,bool *hasFree)

{
  int iVar1;
  _Rb_tree_color _Var2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  _Rb_tree_color _Var5;
  byte bVar6;
  uint uVar7;
  _Base_ptr p_Var8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  _Base_ptr p_Var14;
  _Base_ptr p_Var15;
  long lVar16;
  ulong uVar17;
  unsigned_long_long uVar18;
  bool bVar19;
  bool bVar20;
  char buffer [32];
  vector<FatEntry,_std::allocator<FatEntry>_> entries;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  FatFilename filename;
  FatEntry entry;
  uint local_200;
  int local_1fc;
  uint local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  string local_1c8;
  undefined7 local_1a8;
  undefined1 uStack_1a1;
  undefined3 uStack_1a0;
  char cStack_19d;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined2 uStack_190;
  ushort uStack_18e;
  uint uStack_18c;
  vector<FatEntry,_std::allocator<FatEntry>_> local_188;
  vector<FatEntry,_std::allocator<FatEntry>_> *local_168;
  int *local_160;
  bool *local_158;
  ulong local_150;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_148;
  FatFilename local_118;
  undefined1 local_e0 [32];
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  char local_a0;
  uint local_9c;
  ulong local_98;
  pointer local_90;
  size_type sStack_88;
  undefined8 local_80;
  pointer local_78;
  size_type sStack_70;
  undefined8 local_68;
  unsigned_long_long local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_148._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_148._M_impl.super__Rb_tree_header._M_header;
  local_148._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_148._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_148._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.data._M_dataplus._M_p = (pointer)&local_118.data.field_2;
  local_118.data._M_string_length = 0;
  local_118.data.field_2._M_local_buf[0] = '\0';
  local_118.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.letters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (clusters != (int *)0x0) {
    *clusters = 0;
  }
  if (hasFree != (bool *)0x0) {
    *hasFree = false;
  }
  iVar1 = this->type;
  uVar13 = this->rootDirectory;
  uVar11 = (ulong)cluster;
  local_200 = cluster;
  if (cluster == 0 && iVar1 == 0) {
    local_200 = (uint)uVar13;
    uVar11 = uVar13;
  }
  uVar11 = uVar11 & 0xffffffff;
  bVar19 = uVar13 != uVar11;
  local_148._M_impl.super__Rb_tree_header._M_header._M_right =
       local_148._M_impl.super__Rb_tree_header._M_header._M_left;
  if (uVar11 < this->totalClusters) {
    local_1f8 = (uint)CONCAT71((int7)((ulong)clusters >> 8),uVar13 == uVar11);
    local_1ec = 0;
    local_1f0 = 0;
    uVar13 = 0;
    local_168 = __return_storage_ptr__;
    local_160 = clusters;
    local_158 = hasFree;
    do {
      _Var5 = (_Rb_tree_color)uVar11;
      uVar17 = (ulong)(_Var5 + ~_S_black);
      if (this->type != 0) {
        uVar17 = uVar11;
      }
      uVar18 = this->sectorsPerCluster;
      uVar3 = this->bytesPerSector;
      lVar16 = this->rootEntries << 5;
      if (this->type != 1) {
        lVar16 = 0;
      }
      if (iVar1 != 1 || bVar19) {
        uVar17 = (ulong)(_Var5 + ~_S_black);
      }
      else {
        lVar16 = 0;
      }
      uVar4 = this->dataStart;
      if (local_148._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var8 = local_148._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var15 = &local_148._M_impl.super__Rb_tree_header._M_header;
        do {
          p_Var14 = p_Var15;
          p_Var12 = p_Var8;
          _Var2 = p_Var12[1]._M_color;
          p_Var15 = p_Var12;
          if (_Var2 < _Var5) {
            p_Var15 = p_Var14;
          }
          p_Var8 = (&p_Var12->_M_left)[_Var2 < _Var5];
        } while ((&p_Var12->_M_left)[_Var2 < _Var5] != (_Base_ptr)0x0);
        if ((_Rb_tree_header *)p_Var15 != &local_148._M_impl.super__Rb_tree_header) {
          if (_Var2 < _Var5) {
            p_Var12 = p_Var14;
          }
          if (p_Var12[1]._M_color <= _Var5) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"! Looping directory",0x13);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
            std::ostream::put(' ');
            std::ostream::flush();
            break;
          }
        }
      }
      std::
      _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
      ::_M_insert_unique<unsigned_int_const&>
                ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  *)&local_148,&local_200);
      local_150 = uVar13;
      if (this->bytesPerCluster == 0) {
        bVar6 = 0;
        local_1fc = 0;
        local_1f4 = 0;
      }
      else {
        uVar18 = uVar17 * uVar18 * uVar3 + uVar4 + lVar16;
        uVar13 = 0;
        local_1f4 = 0;
        local_1fc = 0;
        bVar6 = 0;
        do {
          readData(this,uVar18,(char *)&local_1a8,0x20);
          FatEntry::FatEntry((FatEntry *)local_e0);
          local_a0 = cStack_19d;
          local_60 = uVar18;
          if (cStack_19d == '\x0f') {
            FatFilename::append(&local_118,(char *)&local_1a8);
          }
          else {
            local_1e8.field_2._M_allocated_capacity._0_7_ = local_1a8;
            local_1e8.field_2._M_local_buf[7] = (char)_uStack_1a1;
            local_1e8._M_string_length = 0xb;
            local_1e8.field_2._M_local_buf[0xb] = '\0';
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::operator=((string *)local_e0,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,
                              CONCAT17(local_1e8.field_2._M_local_buf[7],
                                       local_1e8.field_2._M_allocated_capacity._0_7_) + 1);
            }
            FatFilename::getFilename_abi_cxx11_(&local_1e8,&local_118);
            std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,
                              CONCAT17(local_1e8.field_2._M_local_buf[7],
                                       local_1e8.field_2._M_allocated_capacity._0_7_) + 1);
            }
            local_98 = (ulong)uStack_18c;
            local_9c = uStack_194 << 0x10 | (uint)uStack_18e;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            local_1e8._M_dataplus._M_p = (pointer)0x20;
            local_1c8._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_1c8,(ulong)&local_1e8);
            local_1c8.field_2._M_allocated_capacity = (size_type)local_1e8._M_dataplus._M_p;
            *(ulong *)(local_1c8._M_dataplus._M_p + 0x10) = CONCAT44(uStack_194,local_198);
            *(ulong *)(local_1c8._M_dataplus._M_p + 0x18) =
                 CONCAT44(uStack_18c,CONCAT22(uStack_18e,uStack_190));
            *(ulong *)local_1c8._M_dataplus._M_p = CONCAT17(uStack_1a1,local_1a8);
            *(ulong *)(local_1c8._M_dataplus._M_p + 8) =
                 CONCAT44(uStack_19c,CONCAT13(cStack_19d,uStack_1a0));
            local_1c8._M_string_length = (size_type)local_1e8._M_dataplus._M_p;
            local_1c8._M_dataplus._M_p[local_1e8._M_dataplus._M_p] = '\0';
            FatEntry::setData((FatEntry *)local_e0,&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,
                              (ulong)(local_1c8.field_2._M_allocated_capacity + 1));
            }
            bVar20 = FatEntry::isZero((FatEntry *)local_e0);
            bVar6 = 1;
            if (!bVar20) {
              bVar20 = FatEntry::isCorrect((FatEntry *)local_e0);
              if ((bVar20) && ((ulong)local_9c < this->totalClusters)) {
                FatDate::FatDate((FatDate *)&local_1e8,(char *)&local_198);
                local_80._7_1_ = local_1e8.field_2._M_local_buf[7];
                local_80._0_7_ = local_1e8.field_2._M_allocated_capacity._0_7_;
                local_90 = local_1e8._M_dataplus._M_p;
                sStack_88 = local_1e8._M_string_length;
                FatDate::FatDate((FatDate *)&local_1e8,(char *)((long)&uStack_194 + 2));
                local_68._7_1_ = local_1e8.field_2._M_local_buf[7];
                local_68._0_7_ = local_1e8.field_2._M_allocated_capacity._0_7_;
                local_78 = local_1e8._M_dataplus._M_p;
                sStack_70 = local_1e8._M_string_length;
                std::vector<FatEntry,_std::allocator<FatEntry>_>::push_back
                          (&local_188,(value_type *)local_e0);
                local_1fc = local_1fc + 1;
                local_1f0 = local_1f0 + 1;
                if ((local_1f8 & 1) == 0) {
                  FatEntry::getFilename_abi_cxx11_(&local_1e8,(FatEntry *)local_e0);
                  iVar9 = std::__cxx11::string::compare((char *)&local_1e8);
                  bVar20 = local_200 == local_9c;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                    operator_delete(local_1e8._M_dataplus._M_p,
                                    CONCAT17(local_1e8.field_2._M_local_buf[7],
                                             local_1e8.field_2._M_allocated_capacity._0_7_) + 1);
                  }
                  local_1f8 = local_1f8 & 0xff;
                  if (bVar20 && iVar9 == 0) {
                    local_1f8 = 1;
                  }
                }
              }
              else {
                local_1f4 = local_1f4 + 1;
                local_1ec = local_1ec + 1;
              }
              bVar6 = 0;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_p != &local_40) {
            operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != &local_b0) {
            operator_delete(local_c0._M_p,local_b0._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
            operator_delete((void *)local_e0._0_8_,local_e0._16_8_ + 1);
          }
          uVar13 = (ulong)((int)uVar13 + 0x20);
          uVar18 = uVar18 + 0x20;
        } while (uVar13 < this->bytesPerCluster);
      }
      uVar17 = local_150;
      uVar7 = local_200;
      if (iVar1 != 1 || bVar19) {
        uVar10 = nextCluster(this,local_200,0);
        uVar11 = (ulong)uVar10;
LAB_0010d027:
        local_200 = (uint)uVar11;
      }
      else {
        uVar11 = (ulong)(local_200 + 1);
        if (uVar11 < this->rootClusters) goto LAB_0010d027;
        local_200 = 0xffffffff;
        uVar11 = 0xffffffff;
      }
      if (local_160 != (int *)0x0) {
        *local_160 = *local_160 + 1;
      }
      bVar20 = (int)uVar11 == 0;
      uVar13 = CONCAT71((int7)(uVar17 >> 8),(byte)uVar17 | bVar20);
      if ((uVar17 & 1) != 0 || bVar20) {
        if (local_158 != (bool *)0x0) {
          *local_158 = true;
        }
        if (((bool)(bVar6 | local_1fc == 0)) || (local_1fc <= local_1f4)) {
          if (local_160 != (int *)0x0 && local_1fc == 0) {
            *local_160 = *local_160 + -1;
          }
          break;
        }
        local_200 = uVar7 + 1;
        uVar11 = (ulong)local_200;
      }
      if (((local_1f8 & 1) == 0) && (local_1f0 < local_1ec)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"! Entries don\'t look good, this is maybe not a directory"
                   ,0x38);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
        __return_storage_ptr__ = local_168;
        goto LAB_0010d0f7;
      }
    } while ((int)uVar11 != -1);
    (local_168->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_168->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_168->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.super__Vector_base<FatEntry,_std::allocator<FatEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__ = local_168;
  }
  else {
LAB_0010d0f7:
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<FatEntry,_std::allocator<FatEntry>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_118.letters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.data._M_dataplus._M_p != &local_118.data.field_2) {
    operator_delete(local_118.data._M_dataplus._M_p,
                    CONCAT71(local_118.data.field_2._M_allocated_capacity._1_7_,
                             local_118.data.field_2._M_local_buf[0]) + 1);
  }
  std::vector<FatEntry,_std::allocator<FatEntry>_>::~vector(&local_188);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_148);
  return __return_storage_ptr__;
}

Assistant:

vector<FatEntry> FatSystem::getEntries(unsigned int cluster, int *clusters, bool *hasFree)
{
    bool isRoot = false;
    bool contiguous = false;
    int foundEntries = 0;
    int badEntries = 0;
    bool isValid = false;
    set<unsigned int> visited;
    vector<FatEntry> entries;
    FatFilename filename;

    if (clusters != NULL) {
        *clusters = 0;
    }

    if (hasFree != NULL) {
        *hasFree = false;
    }

    if (cluster == 0 && type == FAT32) {
        cluster = rootDirectory;
    }

    isRoot = (type==FAT16 && cluster==rootDirectory);

    if (cluster == rootDirectory) {
        isValid = true;
    }

    if (!validCluster(cluster)) {
        return vector<FatEntry>();
    }

    do {
        bool localZero = false;
        int localFound = 0;
        int localBadEntries = 0;
        unsigned long long address = clusterAddress(cluster, isRoot);
        char buffer[FAT_ENTRY_SIZE];
        if (visited.find(cluster) != visited.end()) {
            cerr << "! Looping directory" << endl;
            break;
        }
        visited.insert(cluster);

        unsigned int i;
        for (i=0; i<bytesPerCluster; i+=sizeof(buffer)) {
            // Reading data
            readData(address, buffer, sizeof(buffer));

            // Creating entry
            FatEntry entry;

            entry.attributes = buffer[FAT_ATTRIBUTES];
            entry.address = address;

            if (entry.attributes == FAT_ATTRIBUTES_LONGFILE) {
                // Long file part
                filename.append(buffer);
            } else {
                entry.shortName = string(buffer, 11);
                entry.longName = filename.getFilename();
                entry.size = FAT_READ_LONG(buffer, FAT_FILESIZE)&0xffffffff;
                entry.cluster = (FAT_READ_SHORT(buffer, FAT_CLUSTER_LOW)&0xffff) | (FAT_READ_SHORT(buffer, FAT_CLUSTER_HIGH)<<16);
                entry.setData(string(buffer, sizeof(buffer)));

                if (!entry.isZero()) {
                    if (entry.isCorrect() && validCluster(entry.cluster)) {
                        entry.creationDate = FatDate(&buffer[FAT_CREATION_DATE]);
                        entry.changeDate = FatDate(&buffer[FAT_CHANGE_DATE]);
                        entries.push_back(entry);
                        localFound++;
                        foundEntries++;

                        if (!isValid && entry.getFilename() == "." && entry.cluster == cluster) {
                            isValid = true;
                        }
                    } else {
                        localBadEntries++;
                        badEntries++;
                    }

                    localZero = false;
                } else {
                    localZero = true;
                }
            }

            address += sizeof(buffer);
        }

        int previousCluster = cluster;

        if (isRoot) {
            if (cluster+1 < rootClusters) {
                cluster++;
            } else {
                cluster = FAT_LAST;
            }
        } else {
            cluster = nextCluster(cluster);
        }

        if (clusters) {
            (*clusters)++;
        }

        if (cluster == 0 || contiguous) {
            contiguous = true;

            if (hasFree != NULL) {
                *hasFree = true;
            }
            if (!localZero && localFound && localBadEntries<localFound) {
                cluster = previousCluster+1;
            } else {
                if (!localFound && clusters) {
                    (*clusters)--;
                }
                break;
            }
        }

        if (!isValid) {
            if (badEntries>foundEntries) {
                cerr << "! Entries don't look good, this is maybe not a directory" << endl;
                return vector<FatEntry>();
          }
        }
    } while (cluster != FAT_LAST);

    return entries;
}